

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uloc_tag.cpp
# Opt level: O0

int32_t ulocimp_forLanguageTag_63
                  (char *langtag,int32_t tagLen,char *localeID,int32_t localeIDCapacity,
                  int32_t *parsedLength,UErrorCode *status)

{
  bool bVar1;
  UBool UVar2;
  char cVar3;
  int32_t iVar4;
  int iVar5;
  ULanguageTag *langtag_00;
  size_t sVar6;
  char *pcVar7;
  char *local_78;
  int iStack_68;
  UBool noRegion;
  int32_t n;
  int32_t i;
  int32_t len;
  char *p;
  char *subtag;
  int32_t reslen;
  ULanguageTag *lt;
  UErrorCode *status_local;
  int32_t *parsedLength_local;
  int32_t localeIDCapacity_local;
  char *localeID_local;
  int32_t tagLen_local;
  char *langtag_local;
  
  subtag._4_4_ = 0;
  bVar1 = true;
  langtag_00 = ultag_parse(langtag,tagLen,parsedLength,status);
  UVar2 = U_FAILURE(*status);
  if (UVar2 == '\0') {
    iVar4 = ultag_getExtlangSize(langtag_00);
    if (iVar4 < 1) {
      local_78 = ultag_getLanguage(langtag_00);
    }
    else {
      local_78 = ultag_getExtlang(langtag_00,0);
    }
    iVar5 = strcmp(local_78,"und");
    if (iVar5 != 0) {
      sVar6 = strlen(local_78);
      iVar5 = (int)sVar6;
      if ((0 < iVar5) && (subtag._4_4_ = iVar5, 0 < localeIDCapacity)) {
        iVar4 = uprv_min_63(iVar5,localeIDCapacity);
        memcpy(localeID,local_78,(long)iVar4);
      }
    }
    pcVar7 = ultag_getScript(langtag_00);
    sVar6 = strlen(pcVar7);
    if (0 < (int)sVar6) {
      _i = pcVar7;
      if (subtag._4_4_ < localeIDCapacity) {
        localeID[subtag._4_4_] = '_';
      }
      for (; subtag._4_4_ = subtag._4_4_ + 1, *_i != '\0'; _i = _i + 1) {
        if (subtag._4_4_ < localeIDCapacity) {
          if (_i == pcVar7) {
            cVar3 = uprv_toupper_63(*_i);
            localeID[subtag._4_4_] = cVar3;
          }
          else {
            localeID[subtag._4_4_] = *_i;
          }
        }
      }
    }
    _i = ultag_getRegion(langtag_00);
    sVar6 = strlen(_i);
    if (0 < (int)sVar6) {
      if (subtag._4_4_ < localeIDCapacity) {
        localeID[subtag._4_4_] = '_';
      }
      for (; subtag._4_4_ = subtag._4_4_ + 1, *_i != '\0'; _i = _i + 1) {
        if (subtag._4_4_ < localeIDCapacity) {
          cVar3 = uprv_toupper_63(*_i);
          localeID[subtag._4_4_] = cVar3;
        }
      }
      bVar1 = false;
    }
    iVar4 = ultag_getVariantsSize(langtag_00);
    if (0 < iVar4) {
      if (bVar1) {
        if (subtag._4_4_ < localeIDCapacity) {
          localeID[subtag._4_4_] = '_';
        }
        subtag._4_4_ = subtag._4_4_ + 1;
      }
      for (iStack_68 = 0; iStack_68 < iVar4; iStack_68 = iStack_68 + 1) {
        _i = ultag_getVariant(langtag_00,iStack_68);
        if (subtag._4_4_ < localeIDCapacity) {
          localeID[subtag._4_4_] = '_';
        }
        for (; subtag._4_4_ = subtag._4_4_ + 1, *_i != '\0'; _i = _i + 1) {
          if (subtag._4_4_ < localeIDCapacity) {
            cVar3 = uprv_toupper_63(*_i);
            localeID[subtag._4_4_] = cVar3;
          }
        }
      }
    }
    iVar4 = ultag_getExtensionsSize(langtag_00);
    pcVar7 = ultag_getPrivateUse(langtag_00);
    if ((0 < iVar4) || (sVar6 = strlen(pcVar7), sVar6 != 0)) {
      if ((subtag._4_4_ == 0) && (0 < iVar4)) {
        if (0 < localeIDCapacity) {
          iVar4 = uprv_min_63(3,localeIDCapacity);
          memcpy(localeID,"und",(long)iVar4);
        }
        subtag._4_4_ = 3;
      }
      iVar4 = _appendKeywords(langtag_00,localeID + subtag._4_4_,localeIDCapacity - subtag._4_4_,
                              status);
      subtag._4_4_ = iVar4 + subtag._4_4_;
    }
    ultag_close(langtag_00);
    langtag_local._4_4_ = u_terminateChars_63(localeID,localeIDCapacity,subtag._4_4_,status);
  }
  else {
    langtag_local._4_4_ = 0;
  }
  return langtag_local._4_4_;
}

Assistant:

U_CAPI int32_t U_EXPORT2
ulocimp_forLanguageTag(const char* langtag,
                       int32_t tagLen,
                       char* localeID,
                       int32_t localeIDCapacity,
                       int32_t* parsedLength,
                       UErrorCode* status) {
    ULanguageTag *lt;
    int32_t reslen = 0;
    const char *subtag, *p;
    int32_t len;
    int32_t i, n;
    UBool noRegion = TRUE;

    lt = ultag_parse(langtag, tagLen, parsedLength, status);
    if (U_FAILURE(*status)) {
        return 0;
    }

    /* language */
    subtag = ultag_getExtlangSize(lt) > 0 ? ultag_getExtlang(lt, 0) : ultag_getLanguage(lt);
    if (uprv_compareInvCharsAsAscii(subtag, LANG_UND) != 0) {
        len = (int32_t)uprv_strlen(subtag);
        if (len > 0) {
            if (reslen < localeIDCapacity) {
                uprv_memcpy(localeID, subtag, uprv_min(len, localeIDCapacity - reslen));
            }
            reslen += len;
        }
    }

    /* script */
    subtag = ultag_getScript(lt);
    len = (int32_t)uprv_strlen(subtag);
    if (len > 0) {
        if (reslen < localeIDCapacity) {
            *(localeID + reslen) = LOCALE_SEP;
        }
        reslen++;

        /* write out the script in title case */
        p = subtag;
        while (*p) {
            if (reslen < localeIDCapacity) {
                if (p == subtag) {
                    *(localeID + reslen) = uprv_toupper(*p);
                } else {
                    *(localeID + reslen) = *p;
                }
            }
            reslen++;
            p++;
        }
    }

    /* region */
    subtag = ultag_getRegion(lt);
    len = (int32_t)uprv_strlen(subtag);
    if (len > 0) {
        if (reslen < localeIDCapacity) {
            *(localeID + reslen) = LOCALE_SEP;
        }
        reslen++;
        /* write out the retion in upper case */
        p = subtag;
        while (*p) {
            if (reslen < localeIDCapacity) {
                *(localeID + reslen) = uprv_toupper(*p);
            }
            reslen++;
            p++;
        }
        noRegion = FALSE;
    }

    /* variants */
    n = ultag_getVariantsSize(lt);
    if (n > 0) {
        if (noRegion) {
            if (reslen < localeIDCapacity) {
                *(localeID + reslen) = LOCALE_SEP;
            }
            reslen++;
        }

        for (i = 0; i < n; i++) {
            subtag = ultag_getVariant(lt, i);
            if (reslen < localeIDCapacity) {
                *(localeID + reslen) = LOCALE_SEP;
            }
            reslen++;
            /* write out the variant in upper case */
            p = subtag;
            while (*p) {
                if (reslen < localeIDCapacity) {
                    *(localeID + reslen) = uprv_toupper(*p);
                }
                reslen++;
                p++;
            }
        }
    }

    /* keywords */
    n = ultag_getExtensionsSize(lt);
    subtag = ultag_getPrivateUse(lt);
    if (n > 0 || uprv_strlen(subtag) > 0) {
        if (reslen == 0 && n > 0) {
            /* need a language */
            if (reslen < localeIDCapacity) {
                uprv_memcpy(localeID + reslen, LANG_UND, uprv_min(LANG_UND_LEN, localeIDCapacity - reslen));
            }
            reslen += LANG_UND_LEN;
        }
        len = _appendKeywords(lt, localeID + reslen, localeIDCapacity - reslen, status);
        reslen += len;
    }

    ultag_close(lt);
    return u_terminateChars(localeID, localeIDCapacity, reslen, status);
}